

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int constfolding(FuncState *fs,int op,expdesc *e1,expdesc *e2)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  Value VVar4;
  TValue res;
  Value local_58;
  int local_50;
  Value local_48;
  int local_40;
  Value local_38;
  int local_30;
  
  iVar2 = 0;
  if (e1->t != e1->f) {
    return 0;
  }
  if (e1->k == VKINT) {
    local_30 = 0x13;
  }
  else {
    if (e1->k != VKFLT) {
      return 0;
    }
    local_30 = 3;
  }
  local_38 = (Value)(e1->u).nval;
  if (e2->t != e2->f) {
    return 0;
  }
  if (e2->k == VKINT) {
    local_50 = 0x13;
  }
  else {
    if (e2->k != VKFLT) {
      return 0;
    }
    local_50 = 3;
  }
  local_58 = (Value)(e2->u).nval;
  bVar3 = true;
  if ((uint)op < 0xe) {
    if ((0x2f80U >> (op & 0x1fU) & 1) == 0) {
      if ((0x68U >> (op & 0x1fU) & 1) != 0) {
        VVar4 = local_58;
        if (local_50 == 0x13) {
          VVar4.n = (double)local_58.i;
        }
        bVar3 = VVar4.n != 0.0;
      }
    }
    else {
      VVar4 = local_38;
      if (local_30 != 0x13) {
        bVar3 = false;
        iVar1 = luaV_tointeger((TValue *)&local_38,&local_48.i,0);
        VVar4 = local_48;
        if (iVar1 == 0) goto LAB_00126eb3;
      }
      local_48 = VVar4;
      if (local_50 == 0x13) {
        local_48.gc = local_58.gc;
        bVar3 = true;
      }
      else {
        iVar1 = luaV_tointeger((TValue *)&local_58,&local_48.i,0);
        bVar3 = iVar1 != 0;
      }
    }
  }
LAB_00126eb3:
  if (bVar3) {
    luaO_arith(fs->ls->L,op,(TValue *)&local_38,(TValue *)&local_58,(TValue *)&local_48);
    if (local_40 == 0x13) {
      e1->k = VKINT;
      (e1->u).nval = (lua_Number)local_48;
    }
    else {
      if (local_48.n == 0.0) {
        return 0;
      }
      e1->k = VKFLT;
      (e1->u).nval = (lua_Number)local_48;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int constfolding (FuncState *fs, int op, expdesc *e1,
                                                const expdesc *e2) {
  TValue v1, v2, res;
  if (!tonumeral(e1, &v1) || !tonumeral(e2, &v2) || !validop(op, &v1, &v2))
    return 0;  /* non-numeric operands or not safe to fold */
  luaO_arith(fs->ls->L, op, &v1, &v2, &res);  /* does operation */
  if (ttisinteger(&res)) {
    e1->k = VKINT;
    e1->u.ival = ivalue(&res);
  }
  else {  /* folds neither NaN nor 0.0 (to avoid problems with -0.0) */
    lua_Number n = fltvalue(&res);
    if (luai_numisnan(n) || n == 0)
      return 0;
    e1->k = VKFLT;
    e1->u.nval = n;
  }
  return 1;
}